

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O3

string * __thiscall
SqlGenerator::getFunctionString_abi_cxx11_
          (string *__return_storage_ptr__,SqlGenerator *this,size_t fid)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  string *psVar5;
  char cVar6;
  bool bVar7;
  Function *this_00;
  Attribute *pAVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_t sVar11;
  ulong *puVar12;
  size_type *psVar13;
  size_t sVar14;
  char cVar15;
  ulong uVar16;
  undefined8 uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string fvars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  size_t local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  local_60 = fid;
  local_38 = __return_storage_ptr__;
  this_00 = QueryCompiler::getFunction
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,fid);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  paVar1 = &local_e0.field_2;
  sVar14 = 0;
  do {
    bVar7 = std::bitset<100UL>::test(&this_00->_fVars,sVar14);
    if (bVar7) {
      pAVar8 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          sVar14);
      pcVar3 = (pAVar8->_name)._M_dataplus._M_p;
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar3,pcVar3 + (pAVar8->_name)._M_string_length);
      std::__cxx11::string::append((char *)&local_e0);
      std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_e0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
    }
    sVar14 = sVar14 + 1;
  } while (sVar14 != 100);
  if (local_80._M_string_length != 0) {
    std::__cxx11::string::pop_back();
  }
  psVar5 = local_38;
  sVar14 = local_60;
  paVar2 = &local_80.field_2;
  switch(this_00->_operation) {
  case count:
    cVar15 = '\x01';
    if (9 < local_60) {
      sVar11 = local_60;
      cVar6 = '\x04';
      do {
        cVar15 = cVar6;
        if (sVar11 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0029b592;
        }
        if (sVar11 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0029b592;
        }
        if (sVar11 < 10000) goto LAB_0029b592;
        bVar7 = 99999 < sVar11;
        sVar11 = sVar11 / 10000;
        cVar6 = cVar15 + '\x04';
      } while (bVar7);
      cVar15 = cVar15 + '\x01';
    }
LAB_0029b592:
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_e0,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,sVar14);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2a3963);
    break;
  case sum:
  case linear_sum:
    (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == paVar2) {
      (local_38->field_2)._M_allocated_capacity =
           CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,local_80.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&local_38->field_2 + 8) = local_80.field_2._8_8_;
    }
    else {
      (local_38->_M_dataplus)._M_p = local_80._M_dataplus._M_p;
      (local_38->field_2)._M_allocated_capacity =
           CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,local_80.field_2._M_local_buf[0]);
    }
    local_38->_M_string_length = local_80._M_string_length;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)paVar2;
    goto LAB_0029b61d;
  case quadratic_sum:
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    std::__cxx11::string::append((char *)&local_e0);
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_e0,(ulong)local_80._M_dataplus._M_p);
    break;
  default:
    cVar15 = '\x01';
    if (9 < local_60) {
      sVar11 = local_60;
      cVar6 = '\x04';
      do {
        cVar15 = cVar6;
        if (sVar11 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0029b551;
        }
        if (sVar11 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0029b551;
        }
        if (sVar11 < 10000) goto LAB_0029b551;
        bVar7 = 99999 < sVar11;
        sVar11 = sVar11 / 10000;
        cVar6 = cVar15 + '\x04';
      } while (bVar7);
      cVar15 = cVar15 + '\x01';
    }
LAB_0029b551:
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_e0,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,sVar14);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2a3963);
    break;
  case exponential:
    cVar15 = '\x01';
    if (9 < local_60) {
      sVar11 = local_60;
      cVar6 = '\x04';
      do {
        cVar15 = cVar6;
        if (sVar11 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0029b4c9;
        }
        if (sVar11 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0029b4c9;
        }
        if (sVar11 < 10000) goto LAB_0029b4c9;
        bVar7 = 99999 < sVar11;
        sVar11 = sVar11 / 10000;
        cVar6 = cVar15 + '\x04';
      } while (bVar7);
      cVar15 = cVar15 + '\x01';
    }
LAB_0029b4c9:
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_e0,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,sVar14);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2a3963);
    break;
  case prod:
    cVar15 = '\x01';
    if (9 < local_60) {
      sVar11 = local_60;
      cVar6 = '\x04';
      do {
        cVar15 = cVar6;
        if (sVar11 < 100) {
          cVar15 = cVar15 + -2;
          goto LAB_0029b50d;
        }
        if (sVar11 < 1000) {
          cVar15 = cVar15 + -1;
          goto LAB_0029b50d;
        }
        if (sVar11 < 10000) goto LAB_0029b50d;
        bVar7 = 99999 < sVar11;
        sVar11 = sVar11 / 10000;
        cVar6 = cVar15 + '\x04';
      } while (bVar7);
      cVar15 = cVar15 + '\x01';
    }
LAB_0029b50d:
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_e0,cVar15);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_e0._M_dataplus._M_p,(uint)local_e0._M_string_length,sVar14);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,0x2a3963);
    break;
  case indicator_eq:
    std::operator+(&local_58,"CASE WHEN ",&local_80);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_58);
    puVar12 = (ulong *)(plVar10 + 2);
    if ((ulong *)*plVar10 == puVar12) {
      local_b0 = *puVar12;
      lStack_a8 = plVar10[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *puVar12;
      local_c0 = (ulong *)*plVar10;
    }
    local_b8 = plVar10[1];
    *plVar10 = (long)puVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_a0,vsnprintf,0x148,"%f",SUB84(*this_00->_parameter,0));
    uVar16 = 0xf;
    if (local_c0 != &local_b0) {
      uVar16 = local_b0;
    }
    if (uVar16 < local_a0._M_string_length + local_b8) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar17 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_a0._M_string_length + local_b8) goto LAB_0029b09f;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0);
    }
    else {
LAB_0029b09f:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0._M_dataplus._M_p);
    }
    psVar13 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0.field_2._8_8_ = puVar9[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_e0._M_string_length = puVar9[1];
    *puVar9 = psVar13;
    puVar9[1] = 0;
    *(undefined1 *)psVar13 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_e0);
    goto LAB_0029b423;
  case indicator_neq:
    std::operator+(&local_58,"CASE WHEN ",&local_80);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_58);
    puVar12 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar12) {
      local_b0 = *puVar12;
      lStack_a8 = puVar9[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *puVar12;
      local_c0 = (ulong *)*puVar9;
    }
    local_b8 = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_a0,vsnprintf,0x148,"%f",SUB84(*this_00->_parameter,0));
    uVar16 = 0xf;
    if (local_c0 != &local_b0) {
      uVar16 = local_b0;
    }
    if (uVar16 < local_a0._M_string_length + local_b8) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar17 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_a0._M_string_length + local_b8) goto LAB_0029b13e;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0);
    }
    else {
LAB_0029b13e:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0._M_dataplus._M_p);
    }
    psVar13 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0.field_2._8_8_ = puVar9[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_e0._M_string_length = puVar9[1];
    *puVar9 = psVar13;
    puVar9[1] = 0;
    *(undefined1 *)psVar13 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_e0);
    goto LAB_0029b423;
  case indicator_lt:
    std::operator+(&local_58,"CASE WHEN ",&local_80);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_58);
    puVar12 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar12) {
      local_b0 = *puVar12;
      lStack_a8 = puVar9[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *puVar12;
      local_c0 = (ulong *)*puVar9;
    }
    local_b8 = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_a0,vsnprintf,0x148,"%f",SUB84(*this_00->_parameter,0));
    uVar16 = 0xf;
    if (local_c0 != &local_b0) {
      uVar16 = local_b0;
    }
    if (uVar16 < local_a0._M_string_length + local_b8) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar17 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_a0._M_string_length + local_b8) goto LAB_0029b27c;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0);
    }
    else {
LAB_0029b27c:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0._M_dataplus._M_p);
    }
    psVar13 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0.field_2._8_8_ = puVar9[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_e0._M_string_length = puVar9[1];
    *puVar9 = psVar13;
    puVar9[1] = 0;
    *(undefined1 *)psVar13 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_e0);
    goto LAB_0029b423;
  case indicator_gt:
    std::operator+(&local_58,"CASE WHEN ",&local_80);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_58);
    puVar12 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar12) {
      local_b0 = *puVar12;
      lStack_a8 = puVar9[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *puVar12;
      local_c0 = (ulong *)*puVar9;
    }
    local_b8 = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              (&local_a0,vsnprintf,0x148,"%f",SUB84(*this_00->_parameter,0));
    uVar16 = 0xf;
    if (local_c0 != &local_b0) {
      uVar16 = local_b0;
    }
    if (uVar16 < local_a0._M_string_length + local_b8) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        uVar17 = local_a0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < local_a0._M_string_length + local_b8) goto LAB_0029b1dd;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0);
    }
    else {
LAB_0029b1dd:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0._M_dataplus._M_p);
    }
    psVar13 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0.field_2._8_8_ = puVar9[3];
      local_e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar13;
      local_e0._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_e0._M_string_length = puVar9[1];
    *puVar9 = psVar13;
    puVar9[1] = 0;
    *(undefined1 *)psVar13 = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_e0);
LAB_0029b423:
    (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
    psVar13 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar13) {
      lVar4 = plVar10[3];
      (psVar5->field_2)._M_allocated_capacity = *psVar13;
      *(long *)((long)&psVar5->field_2 + 8) = lVar4;
    }
    else {
      (psVar5->_M_dataplus)._M_p = (pointer)*plVar10;
      (psVar5->field_2)._M_allocated_capacity = *psVar13;
    }
    psVar5->_M_string_length = plVar10[1];
    *plVar10 = (long)psVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_0029b61d;
    goto LAB_0029b618;
  case lr_cont_parameter:
    std::operator+(&local_e0,"(0.15*",&local_80);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_e0);
    break;
  case lr_cat_parameter:
    (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"(0.15)","");
    goto LAB_0029b61d;
  case dynamic:
    (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"1","");
    goto LAB_0029b61d;
  }
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  psVar13 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar13) {
    lVar4 = plVar10[3];
    (psVar5->field_2)._M_allocated_capacity = *psVar13;
    *(long *)((long)&psVar5->field_2 + 8) = lVar4;
  }
  else {
    (psVar5->_M_dataplus)._M_p = (pointer)*plVar10;
    (psVar5->field_2)._M_allocated_capacity = *psVar13;
  }
  psVar5->_M_string_length = plVar10[1];
  *plVar10 = (long)psVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_58._M_dataplus._M_p = local_e0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
LAB_0029b618:
    operator_delete(local_58._M_dataplus._M_p);
  }
LAB_0029b61d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return psVar5;
}

Assistant:

inline string SqlGenerator::getFunctionString(size_t fid)
{
    Function* f = _qc->getFunction(fid);

    string fvars = "";
    for (size_t i = 0; i < NUM_OF_VARIABLES; ++i)
    {
        if (f->_fVars.test(i))
            fvars +=  _td->getAttribute(i)->_name + ",";
    }
    if (!fvars.empty())
        fvars.pop_back();

    switch (f->_operation)
    {
    case Operation::count :
        return "f_"+to_string(fid);
    case Operation::sum :
        return fvars;  
    case Operation::linear_sum :
        return fvars;
    case Operation::quadratic_sum :
        return fvars+"*"+fvars;
    case Operation::prod :
        return "f_"+to_string(fid);
    case Operation::indicator_eq :
        return "CASE WHEN "+fvars+" = "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::indicator_neq :
        return "CASE WHEN "+fvars+" != "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::indicator_lt :
        return "CASE WHEN "+fvars+" <= "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::indicator_gt :
        return "CASE WHEN "+fvars+" > "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::exponential :
        return "f_"+to_string(fid);
    // case Operation::lr_cont_parameter :
    //     return "("+fvars+"_param*"+fvars+")";
    // case Operation::lr_cat_parameter :
    //     return "("+fvars+"_param)";
    case Operation::lr_cont_parameter :
        return "(0.15*"+fvars+")";
    case Operation::lr_cat_parameter :
        return "(0.15)";
    case Operation::dynamic :
      return "1";
    default : return "f_"+to_string(fid);
    }

    return " ";
}